

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::instrs<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  MaybeResult *this;
  bool bVar1;
  Index IVar2;
  reference pvVar3;
  type *ptVar4;
  optional *this_00;
  uint *puVar5;
  Ok local_37a [2];
  Err local_378;
  Err *local_358;
  Err *err_3;
  MaybeResult<wasm::WATParser::Ok> _val_3;
  MaybeResult<wasm::WATParser::Ok> inst_1;
  string local_2f8;
  Err local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  Err local_290;
  Err local_268;
  Err *local_248;
  Err *err_2;
  MaybeResult<wasm::WATParser::Ok> _val_2;
  MaybeResult<wasm::WATParser::Ok> inst;
  WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx> with;
  type *end;
  type *start;
  undefined4 local_1c8;
  optional<unsigned_int> local_1c4;
  Index local_1bc;
  pair<unsigned_int,_std::optional<unsigned_int>_> local_1b8;
  Err local_1a8;
  Err *local_188;
  Err *err_1;
  MaybeResult<wasm::WATParser::Ok> _val_1;
  MaybeResult<wasm::WATParser::Ok> blockinst_1;
  allocator<char> local_121;
  string local_120;
  Err local_100;
  optional<unsigned_int> local_e0;
  Index local_d8;
  pair<unsigned_int,_std::optional<unsigned_int>_> local_d4;
  undefined1 local_c8 [8];
  vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
  foldedInstrs;
  Err local_a8;
  Err *local_88;
  Err *err;
  MaybeResult<wasm::WATParser::Ok> _val;
  undefined1 local_48 [8];
  MaybeResult<wasm::WATParser::Ok> blockinst;
  InstrsT insts;
  ParseDeclsCtx *ctx_local;
  
  NullInstrParserCtx::makeInstrs((NullInstrParserCtx *)ctx);
  do {
    while( true ) {
      foldedBlockinstr<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
                ((MaybeResult<wasm::WATParser::Ok> *)local_48,ctx);
      bVar1 = WATParser::MaybeResult::operator_cast_to_bool((MaybeResult *)local_48);
      if (bVar1) {
        MaybeResult<wasm::WATParser::Ok>::MaybeResult
                  ((MaybeResult<wasm::WATParser::Ok> *)&err,
                   (MaybeResult<wasm::WATParser::Ok> *)local_48);
        local_88 = MaybeResult<wasm::WATParser::Ok>::getErr
                             ((MaybeResult<wasm::WATParser::Ok> *)&err);
        bVar1 = local_88 != (Err *)0x0;
        if (bVar1) {
          WATParser::Err::Err(&local_a8,local_88);
          Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_a8);
          WATParser::Err::~Err(&local_a8);
        }
        foldedInstrs.
        super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
        foldedInstrs.
        super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = bVar1;
        MaybeResult<wasm::WATParser::Ok>::~MaybeResult((MaybeResult<wasm::WATParser::Ok> *)&err);
        if (foldedInstrs.
            super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
          MaybeResult<wasm::WATParser::Ok>::operator*((MaybeResult<wasm::WATParser::Ok> *)local_48);
          NullInstrParserCtx::appendInstr
                    ((NullInstrParserCtx *)ctx,
                     (undefined1 *)
                     ((long)&blockinst.val.
                             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     + 0x27));
          foldedInstrs.
          super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
        }
      }
      else {
        foldedInstrs.
        super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
      MaybeResult<wasm::WATParser::Ok>::~MaybeResult((MaybeResult<wasm::WATParser::Ok> *)local_48);
      if (foldedInstrs.
          super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) break;
joined_r0x01d2fe63:
      if (foldedInstrs.
          super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 1) {
        return __return_storage_ptr__;
      }
    }
    bVar1 = ParseInput::takeLParen(&ctx->in);
    if (bVar1) {
      std::
      vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
      ::vector((vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                *)local_c8);
      local_d8 = ParseInput::getPos(&ctx->in);
      std::optional<unsigned_int>::optional(&local_e0);
      std::pair<unsigned_int,_std::optional<unsigned_int>_>::pair<unsigned_int,_true>
                (&local_d4,&local_d8,&local_e0);
      std::
      vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
      ::push_back((vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                   *)local_c8,&local_d4);
      do {
        bVar1 = std::
                vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                ::empty((vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                         *)local_c8);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          foldedInstrs.
          super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
          break;
        }
        bVar1 = ParseInput::takeUntilParen(&ctx->in);
        if (!bVar1) {
          pvVar3 = std::
                   vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                   ::back((vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                           *)local_c8);
          IVar2 = pvVar3->first;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_120,"unterminated folded instruction",&local_121);
          ParseInput::err(&local_100,&ctx->in,IVar2,&local_120);
          Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_100);
          WATParser::Err::~Err(&local_100);
          std::__cxx11::string::~string((string *)&local_120);
          std::allocator<char>::~allocator(&local_121);
          foldedInstrs.
          super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
          break;
        }
        pvVar3 = std::
                 vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                 ::back((vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                         *)local_c8);
        bVar1 = std::optional::operator_cast_to_bool((optional *)&pvVar3->second);
        if (!bVar1) {
          blockinst_1.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._32_4_ = ParseInput::getPos(&ctx->in);
          std::optional<unsigned_int>::optional<unsigned_int,_true>
                    ((optional<unsigned_int> *)
                     ((long)&blockinst_1.val.
                             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     + 0x24),(uint *)((long)&blockinst_1.val.
                                             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                             .
                                             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                             .
                                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                             .
                                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                             .
                                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     + 0x20));
          pvVar3 = std::
                   vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                   ::back((vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                           *)local_c8);
          (pvVar3->second).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int> = stack0xfffffffffffffed4;
        }
        foldedBlockinstr<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
                  ((MaybeResult<wasm::WATParser::Ok> *)
                   ((long)&_val_1.val.
                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 0x20),ctx);
        bVar1 = WATParser::MaybeResult::operator_cast_to_bool
                          ((MaybeResult *)
                           ((long)&_val_1.val.
                                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           + 0x20));
        if (bVar1) {
          MaybeResult<wasm::WATParser::Ok>::MaybeResult
                    ((MaybeResult<wasm::WATParser::Ok> *)&err_1,
                     (MaybeResult<wasm::WATParser::Ok> *)
                     ((long)&_val_1.val.
                             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     + 0x20));
          local_188 = MaybeResult<wasm::WATParser::Ok>::getErr
                                ((MaybeResult<wasm::WATParser::Ok> *)&err_1);
          bVar1 = local_188 != (Err *)0x0;
          if (bVar1) {
            WATParser::Err::Err(&local_1a8,local_188);
            Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_1a8);
            WATParser::Err::~Err(&local_1a8);
          }
          foldedInstrs.
          super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
          foldedInstrs.
          super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = bVar1;
          MaybeResult<wasm::WATParser::Ok>::~MaybeResult((MaybeResult<wasm::WATParser::Ok> *)&err_1)
          ;
          if (foldedInstrs.
              super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
            MaybeResult<wasm::WATParser::Ok>::operator*
                      ((MaybeResult<wasm::WATParser::Ok> *)
                       ((long)&_val_1.val.
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       + 0x20));
            NullInstrParserCtx::appendInstr
                      ((NullInstrParserCtx *)ctx,
                       (undefined1 *)
                       ((long)&blockinst.val.
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       + 0x27));
            goto LAB_01d2fe0f;
          }
        }
        else {
          bVar1 = ParseInput::takeLParen(&ctx->in);
          if (bVar1) {
            local_1bc = ParseInput::getPos(&ctx->in);
            std::optional<unsigned_int>::optional(&local_1c4);
            std::pair<unsigned_int,_std::optional<unsigned_int>_>::pair<unsigned_int,_true>
                      (&local_1b8,&local_1bc,&local_1c4);
            std::
            vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
            ::push_back((vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                         *)local_c8,&local_1b8);
          }
          else {
            bVar1 = ParseInput::takeRParen(&ctx->in);
            if (!bVar1) {
              handle_unreachable("expected paren",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wat-parser.cpp"
                                 ,0xb56);
            }
            pvVar3 = std::
                     vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                     ::back((vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                             *)local_c8);
            start = *(type **)pvVar3;
            local_1c8._0_1_ =
                 (pvVar3->second).super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._M_engaged;
            local_1c8._1_3_ =
                 *(undefined3 *)
                  &(pvVar3->second).super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int>.field_0x5;
            ptVar4 = std::get<0ul,unsigned_int,std::optional<unsigned_int>>
                               ((pair<unsigned_int,_std::optional<unsigned_int>_> *)&start);
            this_00 = (optional *)
                      std::get<1ul,unsigned_int,std::optional<unsigned_int>>
                                ((pair<unsigned_int,_std::optional<unsigned_int>_> *)&start);
            bVar1 = std::optional::operator_cast_to_bool(this_00);
            if (!bVar1) {
              __assert_fail("end && \"Should have found end of instruction\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wat-parser.cpp"
                            ,0xb47,
                            "Result<typename Ctx::InstrsT> wasm::WATParser::(anonymous namespace)::instrs(Ctx &) [Ctx = wasm::WATParser::(anonymous namespace)::ParseDeclsCtx]"
                           );
            }
            std::
            vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
            ::pop_back((vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                        *)local_c8);
            WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>::WithPosition
                      ((WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx> *)
                       ((long)&inst.val.
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       + 0x20),ctx,*ptVar4);
            plaininstr<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
                      ((MaybeResult<wasm::WATParser::Ok> *)
                       ((long)&_val_2.val.
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       + 0x20),ctx);
            bVar1 = WATParser::MaybeResult::operator_cast_to_bool
                              ((MaybeResult *)
                               ((long)&_val_2.val.
                                       super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               + 0x20));
            if (bVar1) {
              MaybeResult<wasm::WATParser::Ok>::MaybeResult
                        ((MaybeResult<wasm::WATParser::Ok> *)&err_2,
                         (MaybeResult<wasm::WATParser::Ok> *)
                         ((long)&_val_2.val.
                                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         + 0x20));
              local_248 = MaybeResult<wasm::WATParser::Ok>::getErr
                                    ((MaybeResult<wasm::WATParser::Ok> *)&err_2);
              bVar1 = local_248 != (Err *)0x0;
              if (bVar1) {
                WATParser::Err::Err(&local_268,local_248);
                Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_268);
                WATParser::Err::~Err(&local_268);
              }
              foldedInstrs.
              super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
              foldedInstrs.
              super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = bVar1;
              MaybeResult<wasm::WATParser::Ok>::~MaybeResult
                        ((MaybeResult<wasm::WATParser::Ok> *)&err_2);
              if (foldedInstrs.
                  super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
                MaybeResult<wasm::WATParser::Ok>::operator*
                          ((MaybeResult<wasm::WATParser::Ok> *)
                           ((long)&_val_2.val.
                                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           + 0x20));
                NullInstrParserCtx::appendInstr
                          ((NullInstrParserCtx *)ctx,
                           (undefined1 *)
                           ((long)&blockinst.val.
                                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           + 0x27));
                foldedInstrs.
                super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
              }
            }
            else {
              IVar2 = *ptVar4;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2b0,"expected folded instruction",&local_2b1);
              ParseInput::err(&local_290,&ctx->in,IVar2,&local_2b0);
              Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_290);
              WATParser::Err::~Err(&local_290);
              std::__cxx11::string::~string((string *)&local_2b0);
              std::allocator<char>::~allocator(&local_2b1);
              foldedInstrs.
              super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
            }
            MaybeResult<wasm::WATParser::Ok>::~MaybeResult
                      ((MaybeResult<wasm::WATParser::Ok> *)
                       ((long)&_val_2.val.
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       + 0x20));
            if (foldedInstrs.
                super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
              IVar2 = ParseInput::getPos(&ctx->in);
              puVar5 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)this_00);
              if (IVar2 == *puVar5) {
                foldedInstrs.
                super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2f8,"expected end of instruction",
                           (allocator<char> *)
                           ((long)&inst_1.val.
                                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           + 0x27));
                ParseInput::err(&local_2d8,&ctx->in,&local_2f8);
                Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_2d8);
                WATParser::Err::~Err(&local_2d8);
                std::__cxx11::string::~string((string *)&local_2f8);
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           ((long)&inst_1.val.
                                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           + 0x27));
                foldedInstrs.
                super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
              }
            }
            WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>::~WithPosition
                      ((WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx> *)
                       ((long)&inst.val.
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       + 0x20));
            if (foldedInstrs.
                super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_01d2fe19;
          }
LAB_01d2fe0f:
          foldedInstrs.
          super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        }
LAB_01d2fe19:
        MaybeResult<wasm::WATParser::Ok>::~MaybeResult
                  ((MaybeResult<wasm::WATParser::Ok> *)
                   ((long)&_val_1.val.
                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 0x20));
      } while (foldedInstrs.
               super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0);
      std::
      vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
      ::~vector((vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                 *)local_c8);
      goto joined_r0x01d2fe63;
    }
    this = (MaybeResult *)
           ((long)&_val_3.val.
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           + 0x20);
    instr<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
              ((MaybeResult<wasm::WATParser::Ok> *)this,ctx);
    bVar1 = WATParser::MaybeResult::operator_cast_to_bool(this);
    if (bVar1) {
      MaybeResult<wasm::WATParser::Ok>::MaybeResult
                ((MaybeResult<wasm::WATParser::Ok> *)&err_3,
                 (MaybeResult<wasm::WATParser::Ok> *)
                 ((long)&_val_3.val.
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 0x20));
      local_358 = MaybeResult<wasm::WATParser::Ok>::getErr
                            ((MaybeResult<wasm::WATParser::Ok> *)&err_3);
      bVar1 = local_358 != (Err *)0x0;
      if (bVar1) {
        WATParser::Err::Err(&local_378,local_358);
        Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_378);
        WATParser::Err::~Err(&local_378);
      }
      foldedInstrs.
      super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
      foldedInstrs.
      super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = bVar1;
      MaybeResult<wasm::WATParser::Ok>::~MaybeResult((MaybeResult<wasm::WATParser::Ok> *)&err_3);
      if (foldedInstrs.
          super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        MaybeResult<wasm::WATParser::Ok>::operator*
                  ((MaybeResult<wasm::WATParser::Ok> *)
                   ((long)&_val_3.val.
                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 0x20));
        NullInstrParserCtx::appendInstr
                  ((NullInstrParserCtx *)ctx,
                   (undefined1 *)
                   ((long)&blockinst.val.
                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 0x27));
        foldedInstrs.
        super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
    }
    else {
      foldedInstrs.
      super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
    }
    MaybeResult<wasm::WATParser::Ok>::~MaybeResult
              ((MaybeResult<wasm::WATParser::Ok> *)
               ((long)&_val_3.val.
                       super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               + 0x20));
    if (foldedInstrs.
        super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
      if (foldedInstrs.
          super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 1) {
        NullInstrParserCtx::finishInstrs
                  ((NullInstrParserCtx *)ctx,
                   (InstrsT *)
                   ((long)&blockinst.val.
                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 0x27));
        Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>(__return_storage_ptr__,local_37a);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Result<typename Ctx::InstrsT> instrs(Ctx& ctx) {
  auto insts = ctx.makeInstrs();

  while (true) {
    if (auto blockinst = foldedBlockinstr(ctx)) {
      CHECK_ERR(blockinst);
      ctx.appendInstr(insts, *blockinst);
      continue;
    }
    // Parse an arbitrary number of folded instructions.
    if (ctx.in.takeLParen()) {
      // A stack of (start, end) position pairs defining the positions of
      // instructions that need to be parsed after their folded children.
      std::vector<std::pair<Index, std::optional<Index>>> foldedInstrs;

      // Begin a folded instruction. Push its start position and a placeholder
      // end position.
      foldedInstrs.push_back({ctx.in.getPos(), {}});
      while (!foldedInstrs.empty()) {
        // Consume everything up to the next paren. This span will be parsed as
        // an instruction later after its folded children have been parsed.
        if (!ctx.in.takeUntilParen()) {
          return ctx.in.err(foldedInstrs.back().first,
                            "unterminated folded instruction");
        }

        if (!foldedInstrs.back().second) {
          // The folded instruction we just started should end here.
          foldedInstrs.back().second = ctx.in.getPos();
        }

        // We have either the start of a new folded child or the end of the last
        // one.
        if (auto blockinst = foldedBlockinstr(ctx)) {
          CHECK_ERR(blockinst);
          ctx.appendInstr(insts, *blockinst);
        } else if (ctx.in.takeLParen()) {
          foldedInstrs.push_back({ctx.in.getPos(), {}});
        } else if (ctx.in.takeRParen()) {
          auto [start, end] = foldedInstrs.back();
          assert(end && "Should have found end of instruction");
          foldedInstrs.pop_back();

          WithPosition with(ctx, start);
          if (auto inst = plaininstr(ctx)) {
            CHECK_ERR(inst);
            ctx.appendInstr(insts, *inst);
          } else {
            return ctx.in.err(start, "expected folded instruction");
          }

          if (ctx.in.getPos() != *end) {
            return ctx.in.err("expected end of instruction");
          }
        } else {
          WASM_UNREACHABLE("expected paren");
        }
      }
      continue;
    }

    // A non-folded instruction.
    if (auto inst = instr(ctx)) {
      CHECK_ERR(inst);
      ctx.appendInstr(insts, *inst);
    } else {
      break;
    }
  }

  return ctx.finishInstrs(insts);
}